

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall
BanMan::Ban(BanMan *this,CSubNet *sub_net,int64_t ban_time_offset,bool since_unix_epoch)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  mapped_type *pmVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  unique_lock<std::mutex> uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = GetTime();
  bVar1 = ban_time_offset < 1;
  if (ban_time_offset < 1) {
    ban_time_offset = this->m_default_ban_time;
  }
  if (bVar1 || !since_unix_epoch) {
    iVar3 = GetTime();
  }
  else {
    iVar3 = 0;
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_48,&this->m_banned_mutex,
             "m_banned_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
             ,0x8f,false);
  pmVar4 = std::
           map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           ::operator[](&this->m_banned,sub_net);
  if (pmVar4->nBanUntil < iVar3 + ban_time_offset) {
    pmVar4 = std::
             map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
             ::operator[](&this->m_banned,sub_net);
    pmVar4->nVersion = 1;
    pmVar4->nCreateTime = iVar2;
    pmVar4->nBanUntil = iVar3 + ban_time_offset;
    this->m_is_dirty = true;
    std::unique_lock<std::mutex>::~unique_lock(&uStack_48);
    if (this->m_client_interface != (CClientUIInterface *)0x0) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
    DumpBanlist(this);
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&uStack_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Ban(const CSubNet& sub_net, int64_t ban_time_offset, bool since_unix_epoch)
{
    CBanEntry ban_entry(GetTime());

    int64_t normalized_ban_time_offset = ban_time_offset;
    bool normalized_since_unix_epoch = since_unix_epoch;
    if (ban_time_offset <= 0) {
        normalized_ban_time_offset = m_default_ban_time;
        normalized_since_unix_epoch = false;
    }
    ban_entry.nBanUntil = (normalized_since_unix_epoch ? 0 : GetTime()) + normalized_ban_time_offset;

    {
        LOCK(m_banned_mutex);
        if (m_banned[sub_net].nBanUntil < ban_entry.nBanUntil) {
            m_banned[sub_net] = ban_entry;
            m_is_dirty = true;
        } else
            return;
    }
    if (m_client_interface) m_client_interface->BannedListChanged();

    //store banlist to disk immediately
    DumpBanlist();
}